

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

void __thiscall
cmsys::CommandLineArguments::GetUnusedArguments(CommandLineArguments *this,int *argc,char ***argv)

{
  Internal *pIVar1;
  pointer pSVar2;
  pointer pSVar3;
  char **ppcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  size_type *psVar8;
  ulong uVar9;
  bool bVar10;
  
  pIVar1 = this->Internals;
  pSVar2 = (pIVar1->UnusedArguments).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (pIVar1->UnusedArguments).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar9 = (long)pSVar3 - (long)pSVar2 >> 5;
  ppcVar4 = (char **)operator_new__(-(ulong)(uVar9 + 1 >> 0x3d != 0) | uVar9 * 8 + 8);
  pcVar5 = (char *)operator_new__((pIVar1->Argv0).super_string._M_string_length + 1);
  *ppcVar4 = pcVar5;
  strcpy(pcVar5,(pIVar1->Argv0).super_string._M_dataplus._M_p);
  if (pSVar3 == pSVar2) {
    uVar7 = 1;
  }
  else {
    psVar8 = &(pSVar2->super_string)._M_string_length;
    uVar6 = 1;
    do {
      pcVar5 = (char *)operator_new__(*psVar8 + 1);
      ppcVar4[uVar6] = pcVar5;
      strcpy(pcVar5,(((string *)(psVar8 + -1))->_M_dataplus)._M_p);
      uVar7 = uVar6 + 1;
      psVar8 = psVar8 + 4;
      bVar10 = uVar6 < uVar9;
      uVar6 = uVar7;
    } while (bVar10);
  }
  *argc = (int)uVar7;
  *argv = ppcVar4;
  return;
}

Assistant:

void CommandLineArguments::GetUnusedArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size 
    = this->Internals->UnusedArguments.size() + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[ size ];
  args[0] = new char[ this->Internals->Argv0.size() + 1 ];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for ( cc = 0;
    cc < this->Internals->UnusedArguments.size(); cc ++ )
    {
    kwsys::String &str = this->Internals->UnusedArguments[cc];
    args[cnt] = new char[ str.size() + 1];
    strcpy(args[cnt], str.c_str());
    cnt ++;
    }
  *argc = cnt;
  *argv = args;
}